

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void lyxml_free_attrs(ly_ctx *ctx,lyxml_elem *elem)

{
  lyxml_attr *plVar1;
  lyxml_attr *next;
  lyxml_attr *a;
  lyxml_elem *elem_local;
  ly_ctx *ctx_local;
  
  if ((elem != (lyxml_elem *)0x0) && (elem->attr != (lyxml_attr *)0x0)) {
    next = elem->attr;
    do {
      plVar1 = next->next;
      lydict_remove(ctx,next->name);
      lydict_remove(ctx,next->value);
      free(next);
      next = plVar1;
    } while (plVar1 != (lyxml_attr *)0x0);
  }
  return;
}

Assistant:

void
lyxml_free_attrs(struct ly_ctx *ctx, struct lyxml_elem *elem)
{
    struct lyxml_attr *a, *next;
    if (!elem || !elem->attr) {
        return;
    }

    a = elem->attr;
    do {
        next = a->next;

        lydict_remove(ctx, a->name);
        lydict_remove(ctx, a->value);
        free(a);

        a = next;
    } while (a);
}